

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageViewPrivate::relayoutChildren(PageViewPrivate *this,QRect *r)

{
  uint uVar1;
  QSize *pQVar2;
  PageViewPrivate *this_00;
  ulong uVar3;
  ulong uVar4;
  
  pQVar2 = (QSize *)this->viewport;
  QRect::size(r);
  QWidget::resize(pQVar2);
  this_00 = (PageViewPrivate *)this->viewport;
  QWidget::move((QPoint *)this_00);
  uVar1 = (uint)(this->pages).d.size;
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    layoutPage(this_00,(this->pages).d.ptr[uVar3],r);
  }
  layoutControl(this,r);
  return;
}

Assistant:

void
PageViewPrivate::relayoutChildren( const QRect & r )
{
	viewport->resize( r.size() );

	viewport->move( r.topLeft() );

	for( int i = 0, iMax = pages.count(); i < iMax; ++i )
		layoutPage( pages.at( i ), r );

	layoutControl( r );
}